

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nestl_test.hpp
# Opt level: O1

void nestl::test::detail::
     print_tuple<char_const(&)[11],char_const*&,char_const(&)[31],nestl::has_exceptions::exception_ptr_error_const&>
               (ostream *ostream,char (*args) [11],char **args_1,char (*args_2) [31],
               exception_ptr_error *args_3)

{
  void *pvVar1;
  
  pvVar1 = (args_3->m_exception)._M_exception_object;
  if (pvVar1 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  print_tuple_impl<char,std::char_traits<char>,std::tuple<char_const*,char_const*,char_const*,nestl::has_exceptions::exception_ptr_error>,0ul,1ul,2ul,3ul>
            (ostream);
  if (pvVar1 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  return;
}

Assistant:

void print_tuple(std::ostream& ostream, Args&&... args)
{
    print_tuple_impl(ostream, std::make_tuple(args...), gen_seq<sizeof...(Args)>());
}